

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileLibraryTargetGenerator::~cmMakefileLibraryTargetGenerator
          (cmMakefileLibraryTargetGenerator *this)

{
  ~cmMakefileLibraryTargetGenerator(this);
  operator_delete(this,0x440);
  return;
}

Assistant:

cmMakefileLibraryTargetGenerator::~cmMakefileLibraryTargetGenerator()
{
  delete this->OSXBundleGenerator;
}